

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O0

void Msat_ClauseCalcReason
               (Msat_Solver_t *p,Msat_Clause_t *pC,Msat_Lit_t Lit,Msat_IntVec_t *vLits_out)

{
  int *piVar1;
  uint local_2c;
  int i;
  Msat_IntVec_t *vLits_out_local;
  Msat_Lit_t Lit_local;
  Msat_Clause_t *pC_local;
  Msat_Solver_t *p_local;
  
  Msat_IntVecClear(vLits_out);
  if ((Lit != -2) && (Lit != pC[1].Num)) {
    __assert_fail("Lit == MSAT_LIT_UNASSIGNED || Lit == pC->pData[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                  ,0x1a7,
                  "void Msat_ClauseCalcReason(Msat_Solver_t *, Msat_Clause_t *, Msat_Lit_t, Msat_IntVec_t *)"
                 );
  }
  local_2c = (uint)(Lit != -2);
  while( true ) {
    if ((int)(*(uint *)&pC->field_0x4 >> 3 & 0x3fff) <= (int)local_2c) {
      if ((*(uint *)&pC->field_0x4 & 1) != 0) {
        Msat_SolverClaBumpActivity(p,pC);
      }
      return;
    }
    piVar1 = Msat_SolverReadAssignsArray(p);
    if (piVar1[(&pC[1].Num)[(int)local_2c] >> 1] != ((&pC[1].Num)[(int)local_2c] ^ 1U)) break;
    Msat_IntVecPush(vLits_out,(&pC[1].Num)[(int)local_2c] ^ 1);
    local_2c = local_2c + 1;
  }
  __assert_fail("Msat_SolverReadAssignsArray(p)[MSAT_LIT2VAR(pC->pData[i])] == MSAT_LITNOT(pC->pData[i])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                ,0x1aa,
                "void Msat_ClauseCalcReason(Msat_Solver_t *, Msat_Clause_t *, Msat_Lit_t, Msat_IntVec_t *)"
               );
}

Assistant:

void Msat_ClauseCalcReason( Msat_Solver_t * p, Msat_Clause_t * pC, Msat_Lit_t Lit, Msat_IntVec_t * vLits_out )
{
    int i;
    // clear the reason
    Msat_IntVecClear( vLits_out );
    assert( Lit == MSAT_LIT_UNASSIGNED || Lit == pC->pData[0] );
    for ( i = (Lit != MSAT_LIT_UNASSIGNED); i < (int)pC->nSize; i++ )
    {
        assert( Msat_SolverReadAssignsArray(p)[MSAT_LIT2VAR(pC->pData[i])] == MSAT_LITNOT(pC->pData[i]) );
        Msat_IntVecPush( vLits_out, MSAT_LITNOT(pC->pData[i]) );
    }
    if ( pC->fLearned ) 
        Msat_SolverClaBumpActivity( p, pC );
}